

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_sshl_b_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  byte bVar1;
  byte bVar2;
  uintptr_t i;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  
  uVar3 = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    bVar1 = *(byte *)((long)vm + uVar4);
    if ((char)bVar1 < '\0') {
      bVar2 = -bVar1;
      if (bVar1 < 0xf9) {
        bVar2 = 7;
      }
      cVar5 = (char)((int)*(char *)((long)vn + uVar4) >> (bVar2 & 0x1f));
    }
    else if (bVar1 < 8) {
      cVar5 = *(char *)((long)vn + uVar4) << (bVar1 & 0x1f);
    }
    else {
      cVar5 = '\0';
    }
    *(char *)((long)vd + uVar4) = cVar5;
  }
  for (; uVar3 < (desc >> 2 & 0xf8) + 8; uVar3 = uVar3 + 8) {
    *(undefined8 *)((long)vd + uVar3) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_sshl_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc);
    int8_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz; ++i) {
        int8_t mm = m[i];
        int8_t nn = n[i];
        int8_t res = 0;
        if (mm >= 0) {
            if (mm < 8) {
                res = nn << mm;
            }
        } else {
            res = nn >> (mm > -8 ? -mm : 7);
        }
        d[i] = res;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}